

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpair.c
# Opt level: O0

int nn_xpair_create(void *hint,nn_sockbase **sockbase)

{
  nn_sockbase_vfptr *vfptr;
  nn_xpair *in_RSI;
  nn_xpair *self;
  
  vfptr = (nn_sockbase_vfptr *)nn_alloc_(0x157808);
  if (vfptr == (nn_sockbase_vfptr *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/pair/xpair.c"
            ,0x95);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_xpair_init(in_RSI,vfptr,(void *)0x157877);
  (in_RSI->sockbase).vfptr = vfptr;
  return 0;
}

Assistant:

int nn_xpair_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xpair *self;

    self = nn_alloc (sizeof (struct nn_xpair), "socket (pair)");
    alloc_assert (self);
    nn_xpair_init (self, &nn_xpair_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}